

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O2

void printMemOperand(MCInst *MI,int opNum,SStream *O,char *Modifier)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  
  set_mem_access(MI,true);
  printOperand(MI,opNum,O);
  if (Modifier == (char *)0x0) {
LAB_001bac17:
    op = MCInst_getOperand(MI,opNum + 1);
    _Var1 = MCOperand_isReg(op);
    if (_Var1) {
      uVar3 = MCOperand_getReg(op);
      if (uVar3 == 0x47) goto LAB_001bac87;
    }
    _Var1 = MCOperand_isImm(op);
    if (_Var1) {
      iVar4 = MCOperand_getImm(op);
      if (iVar4 == 0) goto LAB_001bac87;
    }
    SStream_concat0(O,"+");
  }
  else {
    iVar2 = strcmp(Modifier,"arith");
    if (iVar2 != 0) goto LAB_001bac17;
    SStream_concat0(O,", ");
  }
  printOperand(MI,opNum + 1,O);
LAB_001bac87:
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O)
{
	// Load/Store memory operands -- imm($reg)
	// If PIC target the target is loaded as the
	// pattern lw $25,%call16($28)
	set_mem_access(MI, true);
	printOperand(MI, opNum + 1, O);
	SStream_concat0(O, "(");
	printOperand(MI, opNum, O);
	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}